

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

double noise_strength_solver_get_value(aom_noise_strength_solver_t *solver,double x)

{
  int iVar1;
  long in_RDI;
  double __x;
  double dVar2;
  double a;
  int bin_i1;
  int bin_i0;
  double bin;
  undefined4 local_2c;
  double in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  __x = noise_strength_solver_get_bin_index
                  ((aom_noise_strength_solver_t *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  dVar2 = floor(__x);
  iVar1 = (int)dVar2;
  if (*(int *)(in_RDI + 0x30) + -1 < iVar1 + 1) {
    local_2c = *(int *)(in_RDI + 0x30) + -1;
  }
  else {
    local_2c = iVar1 + 1;
  }
  return (1.0 - (__x - (double)iVar1)) * *(double *)(*(long *)(in_RDI + 0x10) + (long)iVar1 * 8) +
         (__x - (double)iVar1) * *(double *)(*(long *)(in_RDI + 0x10) + (long)local_2c * 8);
}

Assistant:

static double noise_strength_solver_get_value(
    const aom_noise_strength_solver_t *solver, double x) {
  const double bin = noise_strength_solver_get_bin_index(solver, x);
  const int bin_i0 = (int)floor(bin);
  const int bin_i1 = AOMMIN(solver->num_bins - 1, bin_i0 + 1);
  const double a = bin - bin_i0;
  return (1.0 - a) * solver->eqns.x[bin_i0] + a * solver->eqns.x[bin_i1];
}